

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O3

void ipc_send(void *arg,nni_aio *aio)

{
  nni_list *list;
  _Bool _Var1;
  nni_aio *pnVar2;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  _Var1 = nni_aio_start(aio,ipc_cancel,arg);
  if (_Var1) {
    list = (nni_list *)((long)arg + 0x88);
    nni_aio_list_append(list,aio);
    pnVar2 = (nni_aio *)nni_list_first(list);
    if (pnVar2 == aio) {
      ipc_dowrite((ipc_conn *)arg);
      pnVar2 = (nni_aio *)nni_list_first(list);
      if (pnVar2 == aio) {
        nni_posix_pfd_arm((nni_posix_pfd *)((long)arg + 0x38),4);
      }
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  return;
}

Assistant:

static void
ipc_send(void *arg, nni_aio *aio)
{
	ipc_conn *c = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&c->mtx);

	if (!nni_aio_start(aio, ipc_cancel, c)) {
		nni_mtx_unlock(&c->mtx);
		return;
	}
	nni_aio_list_append(&c->writeq, aio);

	if (nni_list_first(&c->writeq) == aio) {
		ipc_dowrite(c);
		// If we are still the first thing on the list, that
		// means we didn't finish the job, so arm the poller to
		// complete us.
		if (nni_list_first(&c->writeq) == aio) {
			nni_posix_pfd_arm(&c->pfd, NNI_POLL_OUT);
		}
	}
	nni_mtx_unlock(&c->mtx);
}